

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Convolution3DLayerParams::Clear(Convolution3DLayerParams *this)

{
  Arena *pAVar1;
  Convolution3DLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::Clear(&this->outputshape_);
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->weights_ != (WeightParams *)0x0)) &&
     (this->weights_ != (WeightParams *)0x0)) {
    (*(this->weights_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->weights_ = (WeightParams *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->bias_ != (WeightParams *)0x0)) &&
     (this->bias_ != (WeightParams *)0x0)) {
    (*(this->bias_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->bias_ = (WeightParams *)0x0;
  memset(&this->outputchannels_,0,0x50);
  return;
}

Assistant:

void Convolution3DLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.Convolution3DLayerParams)
  outputshape_.Clear();
  if (GetArenaNoVirtual() == NULL && weights_ != NULL) {
    delete weights_;
  }
  weights_ = NULL;
  if (GetArenaNoVirtual() == NULL && bias_ != NULL) {
    delete bias_;
  }
  bias_ = NULL;
  ::memset(&outputchannels_, 0, reinterpret_cast<char*>(&custompaddingright_) -
    reinterpret_cast<char*>(&outputchannels_) + sizeof(custompaddingright_));
}